

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BnB_JointTypeOrdering.cpp
# Opt level: O2

string * __thiscall
BGIP_BnB::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_BnB *this,BnB_JointTypeOrdering type)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)(BnB_JointTypeOrderingNames_abi_cxx11_ + ((ulong)this & 0xffffffff) * 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string BGIP_BnB::SoftPrint(BnB_JointTypeOrdering type)
{
    return BnB_JointTypeOrderingNames[type] ;
}